

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O3

any __thiscall cs_impl::any::make<cs::structure,cs::structure*>(any *this,structure **args)

{
  baseHolder *pbVar1;
  proxy *ppVar2;
  
  if ((DAT_00333ba0 == 0) || (cs::global_thread_counter != 0)) {
    pbVar1 = (baseHolder *)operator_new(0x50);
  }
  else {
    pbVar1 = *(baseHolder **)(&cni_root_namespace::_cni_register_privileged_do + DAT_00333ba0 * 8);
    DAT_00333ba0 = DAT_00333ba0 + -1;
  }
  pbVar1->_vptr_baseHolder = (_func_int **)&PTR__holder_0032b670;
  cs::structure::structure((structure *)(pbVar1 + 1),*args);
  if ((DAT_00339e90 == 0) || (cs::global_thread_counter != 0)) {
    ppVar2 = (proxy *)operator_new(0x18);
  }
  else {
    ppVar2 = (proxy *)(&cs::null_pointer)[DAT_00339e90];
    DAT_00339e90 = DAT_00339e90 + -1;
  }
  ppVar2->is_rvalue = false;
  ppVar2->protect_level = 0;
  ppVar2->refcount = 1;
  ppVar2->data = pbVar1;
  this->mDat = ppVar2;
  return (any)(proxy *)this;
}

Assistant:

static any make(ArgsT &&...args)
		{
			return any(allocator.alloc(1, holder<T>::allocator.alloc(std::forward<ArgsT>(args)...)));
		}